

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupDfsAbs(Wlc_Ntk_t *p,Vec_Int_t *vPisOld,Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *pVVar4;
  Wlc_Obj_t *pWVar5;
  char *pcVar6;
  ushort uVar7;
  int iVar8;
  
  Wlc_NtkCleanCopy(p);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar8 = p->fAsyncRst;
  iVar3 = p->fMemPorts;
  iVar2 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar8;
  pNew->fMemPorts = iVar3;
  pNew->fEasyFfs = iVar2;
  pVVar4 = Vec_IntAlloc(100);
  iVar8 = 0;
  while( true ) {
    if (vPisOld->nSize <= iVar8) {
      iVar8 = 0;
      while( true ) {
        if (vPisNew->nSize <= iVar8) {
          iVar8 = 0;
          while( true ) {
            if (vFlops->nSize <= iVar8) {
              for (iVar8 = 0; iVar8 < (p->vPos).nSize; iVar8 = iVar8 + 1) {
                pWVar5 = Wlc_NtkPo(p,iVar8);
                Wlc_NtkDupDfs_rec(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
              }
              for (iVar8 = 0; iVar8 < vFlops->nSize; iVar8 = iVar8 + 1) {
                iVar3 = Vec_IntEntry(vFlops,iVar8);
                pWVar5 = Wlc_NtkObj(p,iVar3);
                pWVar5 = Wlc_ObjFo2Fi(p,pWVar5);
                Wlc_NtkDupDfs_rec(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
              }
              for (iVar8 = 0; iVar8 < (p->vPos).nSize; iVar8 = iVar8 + 1) {
                pWVar5 = Wlc_NtkPo(p,iVar8);
                pWVar5 = Wlc_ObjCopyObj(pNew,p,pWVar5);
                Wlc_ObjSetCo(pNew,pWVar5,0);
              }
              for (iVar8 = 0; iVar8 < vFlops->nSize; iVar8 = iVar8 + 1) {
                iVar3 = Vec_IntEntry(vFlops,iVar8);
                pWVar5 = Wlc_NtkObj(p,iVar3);
                pWVar5 = Wlc_ObjFo2Fi(p,pWVar5);
                pWVar5 = Wlc_ObjCopyObj(pNew,p,pWVar5);
                Wlc_ObjSetCo(pNew,pWVar5,1);
              }
              Vec_IntFree(pVVar4);
              for (iVar8 = 0; iVar8 < vFlops->nSize; iVar8 = iVar8 + 1) {
                iVar3 = Vec_IntEntry(vFlops,iVar8);
                pWVar5 = Wlc_NtkObj(p,iVar3);
                *(byte *)pWVar5 = *(byte *)pWVar5 | 0x80;
              }
              if (p->vInits != (Vec_Int_t *)0x0) {
                pVVar4 = Wlc_ReduceMarkedInitVec(p,p->vInits);
                pNew->vInits = pVVar4;
              }
              if (p->pInits != (char *)0x0) {
                pcVar6 = Wlc_ReduceMarkedInitStr(p,p->pInits);
                pNew->pInits = pcVar6;
              }
              Wlc_NtkCleanMarks(p);
              if (p->pSpec != (char *)0x0) {
                pcVar6 = Abc_UtilStrsav(p->pSpec);
                pNew->pSpec = pcVar6;
              }
              return pNew;
            }
            iVar3 = Vec_IntEntry(vFlops,iVar8);
            pWVar5 = Wlc_NtkObj(p,iVar3);
            if (((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x1) ||
               ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3d) !=
                (undefined1  [24])0x1)) break;
            Wlc_ObjDup(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
            iVar8 = iVar8 + 1;
          }
          __assert_fail("!Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                        ,0x442,
                        "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar3 = Vec_IntEntry(vPisNew,iVar8);
        pWVar5 = Wlc_NtkObj(p,iVar3);
        uVar7 = *(ushort *)pWVar5 & 0x3f;
        if (uVar7 == 1) break;
        uVar1 = pWVar5->nFanins;
        *(ushort *)pWVar5 = (*(ushort *)pWVar5 & 0xffc0) + 1;
        pWVar5->nFanins = 0;
        Wlc_ObjDup(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
        *(ushort *)pWVar5 = uVar7 | (ushort)*(undefined4 *)pWVar5 & 0xffc0;
        pWVar5->nFanins = uVar1;
        iVar8 = iVar8 + 1;
      }
      __assert_fail("!Wlc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x438,
                    "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar3 = Vec_IntEntry(vPisOld,iVar8);
    pWVar5 = Wlc_NtkObj(p,iVar3);
    if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x1) break;
    Wlc_ObjDup(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
    iVar8 = iVar8 + 1;
  }
  __assert_fail("Wlc_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                ,0x430,
                "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfsAbs( Wlc_Ntk_t * p, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;

    // duplicate marked PIs
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vPisOld, p, pObj, i )
    {
        assert( Wlc_ObjIsPi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }
    // duplicate additional PIs
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
    {
        unsigned Type = pObj->Type;
        int nFanins = Wlc_ObjFaninNum(pObj);
        assert( !Wlc_ObjIsPi(pObj) );
        pObj->Type = WLC_OBJ_PI;
        pObj->nFanins = 0;
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
        pObj->Type = Type;
        pObj->nFanins = (unsigned)nFanins;
    }
    // duplicate flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
    {
        assert( !Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }

    // duplicate logic cones of primary outputs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    // duplidate logic cone of flop inputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj)), vFanins );

    // duplicate POs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), 0 );
    // duplicate flop inputs 
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, Wlc_ObjFo2Fi(p, pObj)), 1 );
    Vec_IntFree( vFanins );

    // mark flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        pObj->Mark = 1;
    if ( p->vInits )
        pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
    if ( p->pInits )
        pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
    Wlc_NtkCleanMarks( p );

    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    //Wlc_NtkTransferNames( pNew, p );
    return pNew;
}